

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

bool Potassco::parseSigned(char **x,longlong *out,longlong sMin,longlong sMax)

{
  char *pcVar1;
  int iVar2;
  longlong lVar3;
  int *piVar4;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  longlong temp;
  char *err;
  char *local_30;
  long local_28;
  long local_20;
  long *local_18;
  long *local_10;
  bool local_1;
  
  if ((*in_RDI == 0) || (*(char *)*in_RDI == '\0')) {
    local_1 = false;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = strncmp((char *)*in_RDI,"imax",4);
    if (((iVar2 == 0) && (*local_18 = local_28, local_28 != 0)) ||
       ((iVar2 = strncmp((char *)*local_10,"imin",4), iVar2 == 0 &&
        (*local_18 = local_20, local_20 != 0)))) {
      *local_10 = *local_10 + 4;
      local_1 = true;
    }
    else {
      pcVar1 = (char *)*local_10;
      iVar2 = detectBase((char *)*local_10);
      lVar3 = strtoll(pcVar1,&local_30,iVar2);
      *local_18 = lVar3;
      if (((*local_18 == 0x7fffffffffffffff) || (*local_18 == -0x8000000000000000)) &&
         (piVar4 = __errno_location(), *piVar4 == 0x22)) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar1 = (char *)*local_10;
        iVar2 = detectBase((char *)*local_10);
        lVar3 = strtoll(pcVar1,(char **)0x0,iVar2);
        piVar4 = __errno_location();
        if ((*piVar4 == 0x22) || (*local_18 != lVar3)) {
          return false;
        }
      }
      if (((local_30 == (char *)*local_10) || (*local_18 < local_20)) || (local_28 < *local_18)) {
        local_1 = false;
      }
      else {
        *local_10 = (long)local_30;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

static bool parseSigned(const char*& x, long long& out, long long sMin, long long sMax) {
	if (!x || !*x) {
		return false;
	}
	if ((std::strncmp(x, "imax", 4) == 0 && (out = sMax) != 0) || (std::strncmp(x, "imin", 4) == 0 && (out = sMin) != 0)) {
		x += 4;
		return true;
	}
	char* err;
	out = strtoll(x, &err, detectBase(x));
	if ((out == LLONG_MAX || out == LLONG_MIN) && errno == ERANGE) {
		errno = 0;
		long long temp = strtoll(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out < sMin || out > sMax) {
		return false;
	}
	x = err;
	return true;
}